

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O1

bool __thiscall QTextDocumentPrivate::split(QTextDocumentPrivate *this,int pos)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  Header *pHVar5;
  QTextFragmentData *pQVar6;
  uint uVar7;
  uint uVar8;
  uint p_1;
  uint uVar9;
  uint uVar10;
  int iVar11;
  FragmentMap *this_00;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  
  this_00 = &this->fragments;
  bVar12 = false;
  uVar9 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,pos,0);
  if (uVar9 != 0) {
    pHVar5 = (this_00->data).field_0.head;
    uVar13 = (ulong)uVar9;
    lVar14 = uVar13 * 0x20;
    iVar11 = *(int *)((long)pHVar5 + lVar14 + 0x10);
    uVar10 = *(uint *)((long)pHVar5 + lVar14);
    uVar8 = uVar10;
    uVar4 = uVar9;
    while (uVar7 = uVar8, uVar7 != 0) {
      puVar2 = (uint *)((long)pHVar5 + (ulong)uVar7 * 0x20);
      if (*(uint *)((long)pHVar5 + (ulong)uVar7 * 0x20 + 8) == uVar4) {
        iVar11 = iVar11 + puVar2[4] + puVar2[5];
      }
      uVar4 = uVar7;
      uVar8 = *puVar2;
    }
    iVar11 = pos - iVar11;
    if (iVar11 == 0) {
      bVar12 = false;
    }
    else {
      iVar3 = *(int *)((long)pHVar5 + lVar14 + 0x14);
      *(int *)((long)pHVar5 + lVar14 + 0x14) = iVar11;
      if (uVar10 != 0) {
        do {
          pHVar5 = (this_00->data).field_0.head;
          puVar2 = (uint *)((long)pHVar5 + (ulong)uVar10 * 0x20);
          if (*(uint *)((long)pHVar5 + (ulong)uVar10 * 0x20 + 4) == uVar9) {
            puVar1 = puVar2 + 4;
            *puVar1 = *puVar1 + (iVar11 - iVar3);
          }
          uVar4 = *puVar2;
          uVar9 = uVar10;
          uVar10 = uVar4;
        } while (uVar4 != 0);
      }
      uVar9 = QFragmentMapData<QTextFragmentData>::insert_single(&this_00->data,pos,iVar3 - iVar11);
      pQVar6 = (this_00->data).field_0.fragments;
      pQVar6[uVar9].stringPosition = iVar11 + pQVar6[uVar13].stringPosition;
      pQVar6[uVar9].format = pQVar6[uVar13].format;
      bVar12 = true;
    }
  }
  return bVar12;
}

Assistant:

bool QTextDocumentPrivate::split(int pos)
{
    uint x = fragments.findNode(pos);
    if (x) {
        int k = fragments.position(x);
//          qDebug("found fragment with key %d, size_left=%d, size=%d to split at %d",
//                k, (*it)->size_left[0], (*it)->size_array[0], pos);
        if (k != pos) {
            Q_ASSERT(k <= pos);
            // need to resize the first fragment and add a new one
            QTextFragmentData *X = fragments.fragment(x);
            int oldsize = X->size_array[0];
            fragments.setSize(x, pos-k);
            uint n = fragments.insert_single(pos, oldsize-(pos-k));
            X = fragments.fragment(x);
            QTextFragmentData *N = fragments.fragment(n);
            N->stringPosition = X->stringPosition + pos-k;
            N->format = X->format;
            return true;
        }
    }
    return false;
}